

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O1

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  ulong uVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  
  puVar3 = *p;
  if (start <= puVar3) {
    uVar1 = bits + 7;
    uVar5 = uVar1 >> 3;
    if (uVar5 < (ulong)((long)puVar3 - (long)start)) {
      bVar6 = ((byte)uVar1 & 0xf8) - (char)bits;
      if (7 < uVar1) {
        bVar2 = buf[uVar5 - 1];
        *p = puVar3 + -1;
        puVar3[-1] = (byte)(-1 << (bVar6 & 0x1f)) & bVar2;
        puVar3 = *p;
        *p = puVar3 + (1 - uVar5);
        memcpy(puVar3 + (1 - uVar5),buf,uVar5 - 1);
      }
      puVar3 = *p;
      *p = puVar3 + -1;
      puVar3[-1] = bVar6;
      iVar4 = mbedtls_asn1_write_len_and_tag(p,start,uVar5 + 1,'\x03');
      return iVar4;
    }
  }
  return -0x6c;
}

Assistant:

int mbedtls_asn1_write_bitstring(unsigned char **p, const unsigned char *start,
                                 const unsigned char *buf, size_t bits)
{
    size_t len = 0;
    size_t unused_bits, byte_len;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    if (*p < start || (size_t) (*p - start) < byte_len + 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = byte_len + 1;

    /* Write the bitstring. Ensure the unused bits are zeroed */
    if (byte_len > 0) {
        byte_len--;
        *--(*p) = buf[byte_len] & ~((0x1 << unused_bits) - 1);
        (*p) -= byte_len;
        memcpy(*p, buf, byte_len);
    }

    /* Write unused bits */
    *--(*p) = (unsigned char) unused_bits;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BIT_STRING);
}